

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void google::protobuf::MessageFactory::InternalRegisterGeneratedFile
               (char *filename,RegistrationFunc *register_messages)

{
  GeneratedMessageFactory *pGVar1;
  LogMessage *pLVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false,_true>,_bool>
  pVar3;
  __node_gen_type __node_gen;
  hash_map<const_char_*,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_void_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *local_50;
  char *local_48;
  RegistrationFunc *local_40;
  
  pGVar1 = anon_unknown_1::GeneratedMessageFactory::singleton();
  local_50 = &pGVar1->file_map_;
  local_48 = filename;
  local_40 = register_messages;
  pVar3 = std::
          _Hashtable<char_const*,std::pair<char_const*const,void(*)(std::__cxx11::string_const&)>,std::allocator<std::pair<char_const*const,void(*)(std::__cxx11::string_const&)>>,std::__detail::_Select1st,google::protobuf::streq,google::protobuf::hash<char_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_insert<std::pair<char_const*const,void(*)(std::__cxx11::string_const&)>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<char_const*const,void(*)(std::__cxx11::string_const&)>,true>>>>
                    ();
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,299);
    pLVar2 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_48,"File is already registered: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,filename);
    internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar2);
    internal::LogMessage::~LogMessage((LogMessage *)&local_48);
  }
  return;
}

Assistant:

void MessageFactory::InternalRegisterGeneratedFile(
    const char* filename, void (*register_messages)(const string&)) {
  GeneratedMessageFactory::singleton()->RegisterFile(filename,
                                                     register_messages);
}